

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<double>_>::AddKel
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  Fad<double> *pFVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Fad<double> prevval;
  Fad<double> local_50;
  
  lVar1 = (elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  lVar6 = 0;
  if (0 < lVar1) {
    lVar6 = lVar1;
  }
  if (iVar4 == 0) {
    for (lVar8 = 0; lVar8 != lVar6; lVar8 = lVar8 + 1) {
      lVar2 = destinationindex->fStore[lVar8];
      for (lVar7 = 0; lVar1 != lVar7; lVar7 = lVar7 + 1) {
        lVar3 = destinationindex->fStore[lVar7];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,this,lVar2,lVar3);
        pFVar5 = TPZFMatrix<Fad<double>_>::operator()(elmat,lVar8,lVar7);
        Fad<double>::operator+=<double,_nullptr>(&local_50,pFVar5);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar3,&local_50);
        Fad<double>::~Fad(&local_50);
      }
    }
  }
  else {
    for (lVar8 = 0; lVar8 != lVar6; lVar8 = lVar8 + 1) {
      lVar2 = destinationindex->fStore[lVar8];
      for (lVar7 = lVar8; lVar1 != lVar7; lVar7 = lVar7 + 1) {
        lVar3 = destinationindex->fStore[lVar7];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,this,lVar2,lVar3);
        pFVar5 = TPZFMatrix<Fad<double>_>::operator()(elmat,lVar8,lVar7);
        Fad<double>::operator+=<double,_nullptr>(&local_50,pFVar5);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar3,&local_50);
        Fad<double>::~Fad(&local_50);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = elmat.Rows();
  	int64_t icoef,jcoef,ieq,jeq;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}